

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

int adiak_hostname(void)

{
  int iVar1;
  char local_218 [8];
  char hostname [512];
  int local_c;
  int result;
  
  iVar1 = adksys_hostname(local_218,0x200);
  if (iVar1 == -1) {
    local_c = -1;
  }
  else {
    local_c = adiak_namevalue("hostname",2,"host","%s",local_218);
  }
  return local_c;
}

Assistant:

int adiak_hostname()
{
   int result;
   char hostname[512];

   result = adksys_hostname(hostname, sizeof(hostname));
   if (result == -1)
      return -1;

   return adiak_namevalue("hostname", adiak_general, "host", "%s", hostname);
}